

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

int64 __thiscall TTD::EventLog::GetPreviousSnapshotInterval(EventLog *this,int64 currentSnapTime)

{
  long lVar1;
  undefined1 local_38 [8];
  Iterator iter;
  
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)local_38,&this->m_eventList);
  while (((local_38 != (undefined1  [8])0x0 &&
          (*(TTEventListLink **)((long)local_38 + 8) <= iter.m_currLink)) &&
         (iter.m_currLink < (TTEventListLink *)*(size_t *)local_38))) {
    if ((*(int *)(*(byte **)((long)local_38 + 0x10) + (long)iter.m_currLink) == 1) &&
       (lVar1 = *(long *)(*(byte **)((long)local_38 + 0x10) + 0x10 + (long)iter.m_currLink),
       lVar1 < currentSnapTime)) {
      return lVar1;
    }
    TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)local_38);
  }
  return -1;
}

Assistant:

int64 EventLog::GetPreviousSnapshotInterval(int64 currentSnapTime) const
    {
        //move the iterator to the current snapshot just before the event
        for(auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly(); iter.IsValid(); iter.MovePrevious_ReplayOnly())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(snapEvent->RestoreTimestamp < currentSnapTime)
                {
                    return snapEvent->RestoreTimestamp;
                }
            }
        }

        return -1;
    }